

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O0

char * Aig_MmStepEntryFetch(Aig_MmStep_t *p,int nBytes)

{
  int iVar1;
  char *pcVar2;
  char **local_28;
  int nBytes_local;
  Aig_MmStep_t *p_local;
  
  if (nBytes == 0) {
    p_local = (Aig_MmStep_t *)0x0;
  }
  else if (p->nMapSize < nBytes) {
    if (p->nChunks == p->nChunksAlloc) {
      p->nChunksAlloc = p->nChunksAlloc << 1;
      if (p->pChunks == (char **)0x0) {
        local_28 = (char **)malloc((long)p->nChunksAlloc << 3);
      }
      else {
        local_28 = (char **)realloc(p->pChunks,(long)p->nChunksAlloc << 3);
      }
      p->pChunks = local_28;
    }
    pcVar2 = (char *)malloc((long)nBytes);
    iVar1 = p->nChunks;
    p->nChunks = iVar1 + 1;
    p->pChunks[iVar1] = pcVar2;
    p_local = (Aig_MmStep_t *)p->pChunks[p->nChunks + -1];
  }
  else {
    p_local = (Aig_MmStep_t *)Aig_MmFixedEntryFetch(p->pMap[nBytes]);
  }
  return (char *)p_local;
}

Assistant:

char * Aig_MmStepEntryFetch( Aig_MmStep_t * p, int nBytes )
{
    if ( nBytes == 0 )
        return NULL;
#ifdef ABC_MEMALIGN
    // extend size to max alignment
    nBytes += (ABC_MEMALIGN - nBytes % ABC_MEMALIGN) % ABC_MEMALIGN;
#endif
    if ( nBytes > p->nMapSize )
    {
        if ( p->nChunks == p->nChunksAlloc )
        {
            p->nChunksAlloc *= 2;
            p->pChunks = ABC_REALLOC( char *, p->pChunks, p->nChunksAlloc ); 
        }
        p->pChunks[ p->nChunks++ ] = ABC_ALLOC( char, nBytes );
        return p->pChunks[p->nChunks-1];
    }
    return Aig_MmFixedEntryFetch( p->pMap[nBytes] );
}